

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_widget_layout_states nk_widget(nk_rect *bounds,nk_context *ctx)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RSI;
  float *in_RDI;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_rect v;
  nk_rect c;
  nk_context *in_stack_ffffffffffffffb8;
  nk_rect *in_stack_ffffffffffffffc0;
  nk_rect local_38;
  nk_rect local_28;
  long local_18;
  float *local_10;
  nk_widget_layout_states local_4;
  
  if (((in_RSI == 0) || (*(long *)(in_RSI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RSI + 0x40d8) + 0xa8) == 0)) {
    local_4 = NK_WIDGET_INVALID;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    nk_panel_alloc_space(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    lVar1 = *(long *)(*(long *)(local_18 + 0x40d8) + 0xa8);
    uVar2 = *(undefined8 *)(lVar1 + 0x44);
    uVar3 = *(undefined8 *)(lVar1 + 0x4c);
    *local_10 = (float)(int)*local_10;
    local_10[1] = (float)(int)local_10[1];
    local_10[2] = (float)(int)local_10[2];
    local_10[3] = (float)(int)local_10[3];
    local_28.x = (float)uVar2;
    local_28.x = (float)(int)local_28.x;
    local_28.y = (float)((ulong)uVar2 >> 0x20);
    local_28.y = (float)(int)local_28.y;
    local_28.w = (float)uVar3;
    local_28.w = (float)(int)local_28.w;
    local_28.h = (float)((ulong)uVar3 >> 0x20);
    local_28.h = (float)(int)local_28.h;
    nk_unify(&local_38,&local_28,*local_10,local_10[1],*local_10 + local_10[2],
             local_10[1] + local_10[3]);
    if (((local_28.x + local_28.w <= *local_10) || (*local_10 + local_10[2] <= local_28.x)) ||
       ((local_28.y + local_28.h <= local_10[1] || (local_10[1] + local_10[3] <= local_28.y)))) {
      local_4 = NK_WIDGET_INVALID;
    }
    else if (((*(float *)(local_18 + 0x144) < local_38.x) ||
             (local_38.x + local_38.w <= *(float *)(local_18 + 0x144))) ||
            ((*(float *)(local_18 + 0x148) < local_38.y ||
             (local_38.y + local_38.h <= *(float *)(local_18 + 0x148))))) {
      local_4 = NK_WIDGET_ROM;
    }
    else {
      local_4 = NK_WIDGET_VALID;
    }
  }
  return local_4;
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget(struct nk_rect *bounds, const struct nk_context *ctx)
{
struct nk_rect c, v;
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return NK_WIDGET_INVALID;

/* allocate space and check if the widget needs to be updated and drawn */
nk_panel_alloc_space(bounds, ctx);
win = ctx->current;
layout = win->layout;
in = &ctx->input;
c = layout->clip;

/*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

/* need to convert to int here to remove floating point errors */
bounds->x = (float)((int)bounds->x);
bounds->y = (float)((int)bounds->y);
bounds->w = (float)((int)bounds->w);
bounds->h = (float)((int)bounds->h);

c.x = (float)((int)c.x);
c.y = (float)((int)c.y);
c.w = (float)((int)c.w);
c.h = (float)((int)c.h);

nk_unify(&v, &c, bounds->x, bounds->y, bounds->x + bounds->w, bounds->y + bounds->h);
if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds->x, bounds->y, bounds->w, bounds->h))
return NK_WIDGET_INVALID;
if (!NK_INBOX(in->mouse.pos.x, in->mouse.pos.y, v.x, v.y, v.w, v.h))
return NK_WIDGET_ROM;
return NK_WIDGET_VALID;
}